

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_ADD(void)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  Z80Reg ZVar5;
  Z80Reg ZVar6;
  uint uVar7;
  undefined1 signedCheck;
  char **ppcVar8;
  Z80Reg ZVar9;
  Z80Reg local_48 [6];
  
  do {
    local_48[0] = Z80_UNK;
    local_48[1] = 0xffffffff;
    local_48[2] = 0xffffffff;
    local_48[3] = 0xffffffff;
    local_48[4] = 0xffffffff;
    local_48[5] = 0xffffffff;
    ppcVar8 = (char **)0x80;
    signedCheck = (char)local_48;
    bVar1 = CommonAluOpcode(0x80,local_48,true,false);
    ZVar9 = local_48[0];
    if (bVar1) goto LAB_001311be;
    ZVar5 = GetRegister(ppcVar8);
    if (ZVar5 == Z80_UNK) {
      return;
    }
    ppcVar8 = &lp;
    bVar1 = comma(&lp);
    if (!bVar1) {
      Error("[ADD] Comma expected",(char *)0x0,PASS3);
      return;
    }
    ZVar6 = GetRegister(ppcVar8);
    if (ZVar5 == Z80_BC) {
LAB_00131338:
      ZVar9 = local_48[0];
      if (DAT_0018a51c != 0) {
        if (ZVar6 == Z80_UNK) {
          uVar4 = GetWordNoMem(ppcVar8);
          local_48[1] = (ZVar5 == Z80_BC) + 0x35;
LAB_0013138b:
          local_48[0] = 0xed;
          local_48[2] = (Z80Reg)(byte)uVar4;
          local_48[3] = (Z80Reg)(uVar4 >> 8);
          resolveRelocationAndSmartSmc(2,REGULAR);
          ZVar9 = local_48[0];
        }
        else if (ZVar6 == Z80_A) {
          local_48[0] = 0xed;
          local_48[1] = Z80_B;
          uVar7 = ZVar5 == Z80_BC | 0x32;
          goto LAB_00131366;
        }
      }
    }
    else {
      if (ZVar5 == Z80_DE) {
        if ((uint)(ZVar6 << 0x1c | (uint)(ZVar6 + ~(Z80_I|Z80_A)) >> 4) < 4) {
          ppcVar8 = (char **)0x1;
          bVar1 = Options::noFakes(true);
          if (!bVar1) {
            local_48[2] = ZVar6 ^ Z80_BC;
            if ((ZVar6 & ~Z80_BC) != Z80_DE) {
              local_48[2] = ZVar6;
            }
            local_48[0] = 0xeb;
            local_48[1] = 0xfffffffe;
            local_48[2] = local_48[2] + ~Z80_MEM_HL;
            local_48[3] = 0xfffffffe;
            local_48[4] = 0xeb;
          }
        }
        goto LAB_00131338;
      }
      ZVar9 = local_48[0];
      if (ZVar5 == Z80_IY) {
LAB_00131262:
        if (((uint)(ZVar6 + ~(Z80_I|Z80_A)) < 0x31) &&
           ((0x1000000010001U >> ((ulong)(uint)(ZVar6 + ~(Z80_I|Z80_A)) & 0x3f) & 1) != 0)) {
          ZVar9 = ZVar5;
          local_48[1] = ZVar6 + ~Z80_MEM_HL;
        }
        else if (((ZVar6 == Z80_IX) || (ZVar6 == Z80_IY)) && (ZVar5 == ZVar6)) {
          local_48[1] = 0x29;
          ZVar9 = ZVar5;
        }
        goto LAB_001311be;
      }
      if (ZVar5 == Z80_SP) {
        if ((ZVar6 != Z80_UNK) || (Options::IsLR35902 == '\0')) goto LAB_001311be;
        local_48[0] = 0xe8;
        bVar3 = GetByteNoMem((char **)0x1,(bool)signedCheck);
        uVar7 = (uint)bVar3;
LAB_00131366:
        ZVar9 = local_48[0];
        local_48[1] = uVar7;
      }
      else {
        if (ZVar5 == Z80_IX) goto LAB_00131262;
        if (ZVar5 == Z80_HL) {
          ZVar9 = ZVar6 + ~Z80_MEM_HL;
          if ((uint)ZVar9 < 0x3a) {
            if ((0x200020002000200U >> ((ulong)(uint)ZVar9 & 0x3f) & 1) == 0) {
              if ((ulong)(uint)ZVar9 != 0) goto LAB_001313ce;
              ZVar9 = local_48[0];
              if (DAT_0018a51c != 0) {
                local_48[0] = 0xed;
                local_48[1] = 0x31;
                ZVar9 = local_48[0];
              }
            }
            goto LAB_001311be;
          }
LAB_001313ce:
          ZVar9 = local_48[0];
          if (DAT_0018a51c == 0) goto LAB_001311be;
          uVar4 = GetWordNoMem(ppcVar8);
          local_48[1] = 0x34;
          goto LAB_0013138b;
        }
      }
    }
LAB_001311be:
    local_48[0] = ZVar9;
    EmitBytes(local_48,true);
    cVar2 = (*DAT_0018a520)(&lp);
    if (cVar2 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_ADD() {
		Z80Reg reg, reg2;
		int reg2ex;
		do {
			int e[] { -1, -1, -1, -1, -1, -1 };
			if (!CommonAluOpcode(0x80, e, true, false)) {	// handle common 8-bit variants
				// add hl|ixy|bc|de|sp,... variants
				reg = GetRegister(lp);	if (Z80_UNK == reg) break;
				if (!comma(lp)) {
					Error("[ADD] Comma expected");
					break;
				}
				reg2 = GetRegister(lp);
				switch (reg) {
				case Z80_HL:
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						e[0] = 0x09 + reg2 - Z80_BC; break;
					case Z80_A:
						if(!Options::syx.IsNextEnabled) break;
						e[0] = 0xED; e[1] = 0x31; break;
					default:
						if(!Options::syx.IsNextEnabled) break;
						word b = GetWordNoMem(lp);
						e[0] = 0xED; e[1] = 0x34 ;
						e[2] = b & 255; e[3] = (b >> 8);
						resolveRelocationAndSmartSmc(2);
						break;
					}
					break;
				case Z80_IX:
				case Z80_IY:
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_SP:
						e[0] = reg; e[1] = 0x09 + reg2 - Z80_BC; break;
					case Z80_IX:
					case Z80_IY:
						if (reg != reg2) break;
						e[0] = reg; e[1] = 0x29; break;
					default:
						break;
					}
					break;
				case Z80_DE:	// fake add de,bc|de|hl|sp
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						if (Options::noFakes()) break;
						reg2ex = (Z80_DE == reg2 || Z80_HL == reg2) ? (reg2^0x10) : reg2;
						e[0] = 0xEB;
						e[1] = INSTRUCTION_START_MARKER; e[2] = 0x09 + reg2ex - Z80_BC;
						e[3] = INSTRUCTION_START_MARKER; e[4] = 0xEB;
						break;
					default: break;
					}
					//continue into `case Z80_BC` for Z80N variants
				case Z80_BC:
					if (!Options::syx.IsNextEnabled) break;   // DE|BC is valid first operand only for Z80N
					if (Z80_A == reg2) {
						e[0] = 0xED; e[1] = 0x32 + (Z80_BC == reg);
					} else if (Z80_UNK == reg2) {
						word b = GetWordNoMem(lp);
						e[0] = 0xED; e[1] = 0x35 + (Z80_BC == reg);
						e[2] = b & 255; e[3] = (b >> 8);
						resolveRelocationAndSmartSmc(2);
					}
					break;
				case Z80_SP:			// Sharp LR35902 "add sp,r8"
					if (!Options::IsLR35902 || Z80_UNK != reg2) break;
					e[0] = 0xE8;
					e[1] = GetByteNoMem(lp, true);
					break;
				default:	break;		// unreachable (already validated by `CommonAluOpcode` call)
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}